

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::Write(ON_Viewport *this,ON_BinaryArchive *file)

{
  view_projection vVar1;
  bool bVar2;
  int iVar3;
  view_projection i;
  double scaleZ;
  double scaleY;
  double scaleX;
  
  bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,5);
  if (bVar2) {
    bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bValidCamera);
    if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bValidFrustum), bVar2)) {
      bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bValidPort);
    }
    else {
      bVar2 = false;
    }
    vVar1 = this->m_projection;
    iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
    if (bVar2 != false) {
      i = this->m_projection;
      if (this->m_projection != perspective_view) {
        i = vVar1;
      }
      if (4 < iVar3) {
        i = vVar1;
      }
      bVar2 = ON_BinaryArchive::WriteInt(file,i);
      if ((((((((bVar2) && (bVar2 = ON_BinaryArchive::WritePoint(file,&this->m_CamLoc), bVar2)) &&
              (bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_CamDir), bVar2)) &&
             ((bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_CamUp), bVar2 &&
              (bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_CamX), bVar2)))) &&
            (bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_CamY), bVar2)) &&
           (((((bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_CamZ), bVar2 &&
               (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_frus_left), bVar2)) &&
              ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_frus_right), bVar2 &&
               (((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_frus_bottom), bVar2 &&
                 (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_frus_top), bVar2)) &&
                (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_frus_near), bVar2)))))) &&
             ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_frus_far), bVar2 &&
              (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_port_left), bVar2)))) &&
            (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_port_right), bVar2)))) &&
          (((bVar2 = ON_BinaryArchive::WriteInt(file,this->m_port_bottom), bVar2 &&
            (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_port_top), bVar2)) &&
           ((bVar2 = ON_BinaryArchive::WriteInt(file,this->m_port_near), bVar2 &&
            (((bVar2 = ON_BinaryArchive::WriteInt(file,this->m_port_far), bVar2 &&
              (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_viewport_id), bVar2)) &&
             (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bLockCamUp), bVar2)))))))) &&
         (((bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bLockCamDir), bVar2 &&
           (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bLockCamLoc), bVar2)) &&
          ((bVar2 = ON_BinaryArchive::WriteBool
                              (file,(bool)((this->m_frustum_symmetry_flags & 2) >> 1)), bVar2 &&
           (((bVar2 = ON_BinaryArchive::WriteBool(file,(bool)(this->m_frustum_symmetry_flags & 1)),
             bVar2 && (bVar2 = ON_BinaryArchive::WritePoint(file,&this->m_target_point), bVar2)) &&
            (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bValidCameraFrame), bVar2)))))))) {
        scaleX = 1.0;
        scaleY = 1.0;
        scaleZ = 1.0;
        GetViewScale(this,&scaleX,&scaleY,&scaleZ);
        bVar2 = ON_BinaryArchive::WriteDouble(file,scaleX);
        if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteDouble(file,scaleY), bVar2)) {
          bVar2 = ON_BinaryArchive::WriteDouble(file,scaleZ);
          return bVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::Write( ON_BinaryArchive& file ) const
{
  // 10 Jan 2022 S. Baer
  // version 1.5: write view scale
  bool rc = file.Write3dmChunkVersion(1,5);
  if (rc) 
  {
    int i = m_bValidCamera?1:0;
    if (rc) rc = file.WriteInt( i );
    i = m_bValidFrustum?1:0;
    if (rc) rc = file.WriteInt( i );
    i = m_bValidPort?1:0;
    if (rc) rc = file.WriteInt( i );
    i = m_projection;
    if ( file.Archive3dmVersion() <= 4 && IsPerspectiveProjection() )
    {
      // V4 files do not support 2 point perspective projection
      i = ON::perspective_view;
    }
    if (rc) rc = file.WriteInt( i );
    if (rc) rc = file.WritePoint( m_CamLoc );
    if (rc) rc = file.WriteVector( m_CamDir );
    if (rc) rc = file.WriteVector( m_CamUp );
    if (rc) rc = file.WriteVector( m_CamX );
    if (rc) rc = file.WriteVector( m_CamY );
    if (rc) rc = file.WriteVector( m_CamZ );
    if (rc) rc = file.WriteDouble( m_frus_left );
    if (rc) rc = file.WriteDouble( m_frus_right );
    if (rc) rc = file.WriteDouble( m_frus_bottom );
    if (rc) rc = file.WriteDouble( m_frus_top );
    if (rc) rc = file.WriteDouble( m_frus_near );
    if (rc) rc = file.WriteDouble( m_frus_far );
    if (rc) rc = file.WriteInt( m_port_left );
    if (rc) rc = file.WriteInt( m_port_right );
    if (rc) rc = file.WriteInt( m_port_bottom );
    if (rc) rc = file.WriteInt( m_port_top );
    if (rc) rc = file.WriteInt( m_port_near );
    if (rc) rc = file.WriteInt( m_port_far );    

    // 1.1 fields
    if (rc) rc = file.WriteUuid(m_viewport_id);

    // 1.2 fields 
    bool b;

    b = CameraUpIsLocked();
    if (rc) rc = file.WriteBool(b);

    b = CameraDirectionIsLocked();
    if (rc) rc = file.WriteBool(b);

    b = CameraLocationIsLocked();
    if (rc) rc = file.WriteBool(b);

    b = FrustumIsLeftRightSymmetric();
    if (rc) rc = file.WriteBool(b);

    b = FrustumIsTopBottomSymmetric();
    if (rc) rc = file.WriteBool(b);

    // 1.3 fields - added 18, June 2013 to V6
    if (rc) rc = file.WritePoint(m_target_point);

    // 1.4 fields - added Oct 13 2016 to V6
    if (rc) rc = file.WriteBool(m_bValidCameraFrame);

    // 1.5 fields - added Jan 10 2022 to V8
    if (rc)
    {
      double scaleX = 1.0, scaleY = 1.0, scaleZ = 1.0;
      GetViewScale(&scaleX, &scaleY, &scaleZ);
      rc = file.WriteDouble(scaleX);
      if (rc) rc = file.WriteDouble(scaleY);
      if (rc) rc = file.WriteDouble(scaleZ);
    }
  }
  return rc;
}